

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.cpp
# Opt level: O1

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  size_t sVar6;
  uchar *src;
  size_t slen;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t local_40;
  uchar *local_38;
  
  iVar4 = -0x1480;
  if (ctx != (mbedtls_pem_context *)0x0) {
    puVar5 = (uchar *)strstr((char *)data,header);
    iVar4 = -0x1080;
    if (puVar5 != (uchar *)0x0) {
      local_38 = (uchar *)strstr((char *)data,footer);
      if (puVar5 < local_38) {
        sVar6 = strlen(header);
        lVar1 = (puVar5[sVar6] == ' ') + sVar6;
        if (puVar5[(ulong)(puVar5[(puVar5[sVar6] == ' ') + sVar6] == '\r') + lVar1] == '\n') {
          lVar1 = (ulong)(puVar5[(puVar5[sVar6] == ' ') + sVar6] == '\r') + lVar1;
          src = puVar5 + lVar1 + 1;
          sVar6 = strlen(footer);
          lVar2 = (local_38[sVar6] == ' ') + sVar6;
          *use_len = (size_t)(local_38 +
                             (((ulong)(local_38[(ulong)(local_38[(local_38[sVar6] == ' ') + sVar6]
                                                       == '\r') + lVar2] == '\n') +
                              (ulong)(local_38[(local_38[sVar6] == ' ') + sVar6] == '\r') + lVar2) -
                             (long)data));
          slen = (long)local_38 - (long)src;
          if (((long)slen < 0x16) ||
             (auVar8[0] = -(puVar5[lVar1 + 7] == 'y'), auVar8[1] = -(puVar5[lVar1 + 8] == 'p'),
             auVar8[2] = -(puVar5[lVar1 + 9] == 'e'), auVar8[3] = -(puVar5[lVar1 + 10] == ':'),
             auVar8[4] = -(puVar5[lVar1 + 0xb] == ' '), auVar8[5] = -(puVar5[lVar1 + 0xc] == '4'),
             auVar8[6] = -(puVar5[lVar1 + 0xd] == ','), auVar8[7] = -(puVar5[lVar1 + 0xe] == 'E'),
             auVar8[8] = -(puVar5[lVar1 + 0xf] == 'N'), auVar8[9] = -(puVar5[lVar1 + 0x10] == 'C'),
             auVar8[10] = -(puVar5[lVar1 + 0x11] == 'R'),
             auVar8[0xb] = -(puVar5[lVar1 + 0x12] == 'Y'),
             auVar8[0xc] = -(puVar5[lVar1 + 0x13] == 'P'),
             auVar8[0xd] = -(puVar5[lVar1 + 0x14] == 'T'),
             auVar8[0xe] = -(puVar5[lVar1 + 0x15] == 'E'),
             auVar8[0xf] = -(puVar5[lVar1 + 0x16] == 'D'), auVar7[0] = -(*src == 'P'),
             auVar7[1] = -(puVar5[lVar1 + 2] == 'r'), auVar7[2] = -(puVar5[lVar1 + 3] == 'o'),
             auVar7[3] = -(puVar5[lVar1 + 4] == 'c'), auVar7[4] = -(puVar5[lVar1 + 5] == '-'),
             auVar7[5] = -(puVar5[lVar1 + 6] == 'T'), auVar7[6] = -(puVar5[lVar1 + 7] == 'y'),
             auVar7[7] = -(puVar5[lVar1 + 8] == 'p'), auVar7[8] = -(puVar5[lVar1 + 9] == 'e'),
             auVar7[9] = -(puVar5[lVar1 + 10] == ':'), auVar7[10] = -(puVar5[lVar1 + 0xb] == ' '),
             auVar7[0xb] = -(puVar5[lVar1 + 0xc] == '4'),
             auVar7[0xc] = -(puVar5[lVar1 + 0xd] == ','),
             auVar7[0xd] = -(puVar5[lVar1 + 0xe] == 'E'),
             auVar7[0xe] = -(puVar5[lVar1 + 0xf] == 'N'),
             auVar7[0xf] = -(puVar5[lVar1 + 0x10] == 'C'), auVar7 = auVar7 & auVar8,
             (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff)) {
            iVar4 = -0x1100;
            if (src < local_38) {
              iVar3 = mbedtls_base64_decode((uchar *)0x0,0,&local_40,src,slen);
              sVar6 = local_40;
              iVar4 = -0x112c;
              if (iVar3 != -0x2c) {
                iVar4 = -0x1480;
                if (local_40 != 0) {
                  puVar5 = (uchar *)calloc(1,local_40);
                  if (puVar5 == (uchar *)0x0) {
                    iVar4 = -0x1180;
                  }
                  else {
                    iVar4 = mbedtls_base64_decode(puVar5,sVar6,&local_40,src,slen);
                    if (iVar4 == 0) {
                      ctx->buf = puVar5;
                      ctx->buflen = local_40;
                      iVar4 = 0;
                    }
                    else {
                      mbedtls_zeroize_and_free(puVar5,local_40);
                      iVar4 = iVar4 + -0x1100;
                    }
                  }
                }
              }
            }
          }
          else {
            iVar4 = -0x1400;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_pem_read_buffer(mbedtls_pem_context *ctx, const char *header, const char *footer,
                            const unsigned char *data, const unsigned char *pwd,
                            size_t pwdlen, size_t *use_len)
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(PEM_RFC1421)
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* PEM_RFC1421 */

    if (ctx == NULL) {
        return MBEDTLS_ERR_PEM_BAD_INPUT_DATA;
    }

    s1 = (unsigned char *) strstr((const char *) data, header);

    if (s1 == NULL) {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    s2 = (unsigned char *) strstr((const char *) data, footer);

    if (s2 == NULL || s2 <= s1) {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    s1 += strlen(header);
    if (*s1 == ' ') {
        s1++;
    }
    if (*s1 == '\r') {
        s1++;
    }
    if (*s1 == '\n') {
        s1++;
    } else {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    end = s2;
    end += strlen(footer);
    if (*end == ' ') {
        end++;
    }
    if (*end == '\r') {
        end++;
    }
    if (*end == '\n') {
        end++;
    }
    *use_len = (size_t) (end - data);

    enc = 0;

    if (s2 - s1 >= 22 && memcmp(s1, "Proc-Type: 4,ENCRYPTED", 22) == 0) {
#if defined(PEM_RFC1421)
        enc++;

        s1 += 22;
        if (*s1 == '\r') {
            s1++;
        }
        if (*s1 == '\n') {
            s1++;
        } else {
            return MBEDTLS_ERR_PEM_INVALID_DATA;
        }


#if defined(MBEDTLS_DES_C)
        if (s2 - s1 >= 23 && memcmp(s1, "DEK-Info: DES-EDE3-CBC,", 23) == 0) {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if (s2 - s1 < 16 || pem_get_iv(s1, pem_iv, 8) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 16;
        } else if (s2 - s1 >= 18 && memcmp(s1, "DEK-Info: DES-CBC,", 18) == 0) {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if (s2 - s1 < 16 || pem_get_iv(s1, pem_iv, 8) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if (s2 - s1 >= 14 && memcmp(s1, "DEK-Info: AES-", 14) == 0) {
            if (s2 - s1 < 22) {
                return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
            } else if (memcmp(s1, "DEK-Info: AES-128-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            } else if (memcmp(s1, "DEK-Info: AES-192-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            } else if (memcmp(s1, "DEK-Info: AES-256-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            } else {
                return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
            }

            s1 += 22;
            if (s2 - s1 < 32 || pem_get_iv(s1, pem_iv, 16) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if (enc_alg == MBEDTLS_CIPHER_NONE) {
            return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
        }

        if (*s1 == '\r') {
            s1++;
        }
        if (*s1 == '\n') {
            s1++;
        } else {
            return MBEDTLS_ERR_PEM_INVALID_DATA;
        }
#else
        return MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE;
#endif /* PEM_RFC1421 */
    }

    if (s1 >= s2) {
        return MBEDTLS_ERR_PEM_INVALID_DATA;
    }

    ret = mbedtls_base64_decode(NULL, 0, &len, s1, (size_t) (s2 - s1));

    if (ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PEM_INVALID_DATA, ret);
    }

    if (len == 0) {
        return MBEDTLS_ERR_PEM_BAD_INPUT_DATA;
    }

    if ((buf = (unsigned char *)mbedtls_calloc(1, len)) == NULL) {
        return MBEDTLS_ERR_PEM_ALLOC_FAILED;
    }

    if ((ret = mbedtls_base64_decode(buf, len, &len, s1, (size_t) (s2 - s1))) != 0) {
        mbedtls_zeroize_and_free(buf, len);
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PEM_INVALID_DATA, ret);
    }

    if (enc != 0) {
#if defined(PEM_RFC1421)
        if (pwd == NULL) {
            mbedtls_zeroize_and_free(buf, len);
            return MBEDTLS_ERR_PEM_PASSWORD_REQUIRED;
        }

        ret = 0;

#if defined(MBEDTLS_DES_C)
        if (enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC) {
            ret = pem_des3_decrypt(pem_iv, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_DES_CBC) {
            ret = pem_des_decrypt(pem_iv, buf, len, pwd, pwdlen);
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if (enc_alg == MBEDTLS_CIPHER_AES_128_CBC) {
            ret = pem_aes_decrypt(pem_iv, 16, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_AES_192_CBC) {
            ret = pem_aes_decrypt(pem_iv, 24, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_AES_256_CBC) {
            ret = pem_aes_decrypt(pem_iv, 32, buf, len, pwd, pwdlen);
        }
#endif /* MBEDTLS_AES_C */

        if (ret != 0) {
            mbedtls_zeroize_and_free(buf, len);
            return ret;
        }

        /* Check PKCS padding and update data length based on padding info.
         * This can be used to detect invalid padding data and password
         * mismatches. */
        size_t unpadded_len;
        ret = pem_check_pkcs_padding(buf, len, &unpadded_len);
        if (ret != 0) {
            mbedtls_zeroize_and_free(buf, len);
            return ret;
        }
        len = unpadded_len;
#else
        mbedtls_zeroize_and_free(buf, len);
        return MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE;
#endif /* PEM_RFC1421 */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return 0;
}